

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialassetid.cpp
# Opt level: O0

void __thiscall
ConfidentialAssetId_GetCommitment_Test::TestBody(ConfidentialAssetId_GetCommitment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_120;
  Message local_118;
  string local_110;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  ConfidentialAssetId commitment;
  string local_b0;
  undefined1 local_90 [8];
  BlindFactor abf;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  ConfidentialAssetId asset;
  ConfidentialAssetId_GetCommitment_Test *this_local;
  
  asset._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
             &local_59);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3",
             (allocator *)&commitment.field_0x27);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&commitment.field_0x27);
  cfd::core::ConfidentialAssetId::GetCommitment
            ((ConfidentialAssetId *)&gtest_ar.message_,(ConfidentialAssetId *)local_38,
             (BlindFactor *)local_90);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_110,(ConfidentialAssetId *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_f0,"commitment.GetHex().c_str()",
             "\"0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29\"",pcVar2,
             "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialassetid.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar.message_);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_90);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_38);
  return;
}

Assistant:

TEST(ConfidentialAssetId, GetCommitment) {
  ConfidentialAssetId asset(
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  BlindFactor abf(
      "346dbdba35c19f6e3958a2c00881024503f6611d23d98d270b98ef9de3edc7a3");
  ConfidentialAssetId commitment = ConfidentialAssetId::GetCommitment(
      asset, abf);
  EXPECT_STREQ(
      commitment.GetHex().c_str(),
      "0a533b742a568c0b5285bf5bdfe9623a78082d19fac9be1678f7c3adbb48b34d29");
}